

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O1

void __thiscall Fl_Graphics_Driver::push_clip(Fl_Graphics_Driver *this,int x,int y,int w,int h)

{
  int iVar1;
  Fl_Region p_Var2;
  undefined8 in_RAX;
  Fl_Region p_Var3;
  Fl_Region p_Var4;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  bool bVar5;
  
  bVar5 = h < 1 || w < 1;
  if (bVar5) {
    p_Var4 = (Fl_Region)
             XCreateRegion(bVar5,CONCAT44(in_register_00000034,x),CONCAT44(in_register_00000014,y));
  }
  else {
    p_Var3 = XRectangleRegion((int)((ulong)in_RAX >> 0x20),(int)in_RAX,0,0x1f3aaa);
    p_Var2 = this->rstack[this->rstackptr];
    p_Var4 = p_Var3;
    if (p_Var2 != (Fl_Region)0x0) {
      p_Var4 = (Fl_Region)XCreateRegion();
      XIntersectRegion(p_Var2,p_Var3,p_Var4);
      XDestroyRegion(p_Var3);
    }
  }
  iVar1 = this->rstackptr;
  if ((long)iVar1 < 9) {
    this->rstackptr = iVar1 + 1;
    this->rstack[(long)iVar1 + 1] = p_Var4;
  }
  else {
    (*Fl::warning)("fl_push_clip: clip stack overflow!\n");
  }
  restore_clip(fl_graphics_driver);
  return;
}

Assistant:

void Fl_Graphics_Driver::push_clip(int x, int y, int w, int h) {
  Fl_Region r;
  if (w > 0 && h > 0) {
    r = XRectangleRegion(x,y,w,h);
    Fl_Region current = rstack[rstackptr];
    if (current) {
#if defined(USE_X11)
      Fl_Region temp = XCreateRegion();
      XIntersectRegion(current, r, temp);
      XDestroyRegion(r);
      r = temp;
#elif defined(WIN32)
      CombineRgn(r,r,current,RGN_AND);
#elif defined(__APPLE_QUARTZ__)
      XDestroyRegion(r);
      r = Fl_X::intersect_region_and_rect(current, x,y,w,h);
#else
# error unsupported platform
#endif
    }
  } else { // make empty clip region:
#if defined(USE_X11)
    r = XCreateRegion();
#elif defined(WIN32)
    r = CreateRectRgn(0,0,0,0);
#elif defined(__APPLE_QUARTZ__)
    r = XRectangleRegion(0,0,0,0);
#else
# error unsupported platform
#endif
  }
  if (rstackptr < region_stack_max) rstack[++rstackptr] = r;
  else Fl::warning("fl_push_clip: clip stack overflow!\n");
  fl_restore_clip();
}